

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_effect.cpp
# Opt level: O1

void P_DrawRailTrail(AActor *source,TArray<SPortalHit,_SPortalHit> *portalhits,int color1,int color2
                    ,double maxdiff,int flags,PClassActor *spawnclass,DAngle *angle,int duration,
                    double sparsity,double drift,int SpiralOffset,DAngle *pitch)

{
  SPortalHit *pSVar1;
  player_t *ppVar2;
  double dVar3;
  bool bVar4;
  WORD WVar5;
  FSoundID FVar6;
  uint32 uVar7;
  int iVar8;
  uint uVar9;
  AWeapon *pAVar10;
  AActor *pAVar11;
  particle_t *ppVar12;
  int iVar13;
  TrailSegment *pTVar14;
  TrailSegment *pTVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  int innerduration;
  uint uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  ulong in_XMM0_Qb;
  ulong in_XMM1_Qb;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  TrailSegment seg;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  TArray<TrailSegment,_TrailSegment> local_198;
  double local_188;
  ulong uStack_180;
  double local_178;
  ulong uStack_170;
  double local_168;
  AWeapon *local_160;
  double local_158;
  ulong uStack_150;
  double local_148;
  ulong uStack_140;
  undefined8 local_138;
  ulong uStack_130;
  double local_128;
  ulong uStack_120;
  double local_118;
  undefined8 uStack_110;
  double local_108;
  ulong uStack_100;
  double local_f8;
  int local_ec;
  double local_e8;
  ulong uStack_e0;
  double local_d8;
  ulong uStack_d0;
  double local_c8 [4];
  double local_a8;
  FSoundID local_a0;
  FSoundID local_9c;
  TrailSegment local_98;
  
  local_138 = (double)CONCAT44(local_138._4_4_,flags);
  local_188 = (double)CONCAT44(local_188._4_4_,color1);
  local_198.Array = (TrailSegment *)0x0;
  local_198.Most = 0;
  local_198.Count = 0;
  dVar21 = 0.0;
  local_178 = sparsity;
  uStack_170 = in_XMM1_Qb;
  local_160 = (AWeapon *)source;
  local_148 = maxdiff;
  uStack_140 = in_XMM0_Qb;
  local_118 = drift;
  if (portalhits->Count != 1) {
    uVar18 = 0;
    do {
      pSVar1 = portalhits->Array;
      local_98.start.Z = pSVar1[uVar18].ContPos.Z;
      local_98.start.Y = pSVar1[uVar18].ContPos.Y;
      local_98.start.X = pSVar1[uVar18].ContPos.X;
      local_98.dir.Z = pSVar1[uVar18].OutDir.Z;
      local_98.dir.Y = pSVar1[uVar18].OutDir.Y;
      local_98.dir.X = pSVar1[uVar18].OutDir.X;
      dVar27 = pSVar1[uVar18 + 1].HitPos.X - local_98.start.X;
      dVar29 = pSVar1[uVar18 + 1].HitPos.Y - local_98.start.Y;
      dVar20 = pSVar1[uVar18 + 1].HitPos.Z - local_98.start.Z;
      dVar27 = c_sqrt(dVar20 * dVar20 + dVar29 * dVar29 + dVar27 * dVar27);
      uVar18 = uVar18 + 1;
      dVar20 = 1.0;
      iVar13 = 0;
      iVar17 = 0;
      do {
        lVar16 = 0;
        if (iVar13 != 0) {
          lVar16 = (ulong)(iVar13 != 1) * 8 + 8;
        }
        dVar29 = ABS(*(double *)((long)&local_98.dir.X + lVar16));
        iVar8 = iVar13;
        if (dVar20 <= dVar29) {
          iVar8 = iVar17;
          dVar29 = dVar20;
        }
        dVar20 = dVar29;
        iVar13 = iVar13 + 1;
        iVar17 = iVar8;
      } while (iVar13 != 3);
      lVar16 = (ulong)(iVar8 != 1) * 8 + 8;
      if (iVar8 == 0) {
        lVar16 = 0;
      }
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      local_c8[2] = 0.0;
      *(undefined8 *)((long)local_c8 + lVar16) = 0x3ff0000000000000;
      dVar20 = local_98.dir.Z * local_c8[2] +
               local_98.dir.Y * local_c8[1] + local_98.dir.X * local_c8[0];
      local_98.extend.X = (local_c8[0] - local_98.dir.X * dVar20) * 3.0;
      local_98.extend.Y = (local_c8[1] - local_98.dir.Y * dVar20) * 3.0;
      local_98.extend.Z = (local_c8[2] - dVar20 * local_98.dir.Z) * 3.0;
      dVar20 = *(double *)((&DAT_00a39408)[(long)consoleplayer * 0x54] + 0x48);
      dVar29 = *(double *)((&DAT_00a39408)[(long)consoleplayer * 0x54] + 0x50);
      dVar24 = (-local_98.dir.Y * (local_98.start.Y - dVar29) -
               (local_98.start.X - dVar20) * local_98.dir.X) / (dVar27 * dVar27);
      dVar25 = 1.0;
      if (dVar24 <= 1.0) {
        dVar25 = dVar24;
      }
      dVar25 = (double)(-(ulong)(0.0 < dVar24) & (ulong)dVar25);
      local_98.soundpos.X = local_98.dir.X * dVar25 + local_98.start.X;
      local_98.soundpos.Y = dVar25 * local_98.dir.Y + local_98.start.Y;
      dVar20 = local_98.soundpos.X - dVar20;
      dVar29 = local_98.soundpos.Y - dVar29;
      local_98.sounddist = dVar29 * dVar29 + dVar20 * dVar20;
      local_98.length = dVar27;
      TArray<TrailSegment,_TrailSegment>::Push(&local_198,&local_98);
      dVar21 = dVar21 + dVar27;
    } while (uVar18 < portalhits->Count - 1);
  }
  dVar21 = dVar21 / 3.0 + -0.499999985 + 6755399441055744.0;
  if (SUB84(dVar21,0) != 0) {
    iVar17 = local_188._0_4_;
    if (((ulong)local_138 & 1) == 0) {
      ppVar2 = *(player_t **)((long)&(local_160->super_AInventory).super_AActor + 0x200);
      pAVar10 = local_160;
      if ((ppVar2 == (player_t *)0x0) || (pAVar10 = ppVar2->ReadyWeapon, pAVar10 != (AWeapon *)0x0))
      {
        FVar6.ID = (((FSoundIDNoInit *)((long)&(pAVar10->super_AInventory).super_AActor + 0x388))->
                   super_FSoundID).ID;
      }
      else {
        FVar6.ID = S_FindSound((char *)0x0);
      }
      if (FVar6.ID == 0) {
        FVar6.ID = S_FindSound("weapons/railgf");
      }
      pAVar11 = (AActor *)(&DAT_00a39408)[(long)consoleplayer * 0x54];
      if ((pAVar11 != (AActor *)0x0) &&
         (((pAVar11->super_DThinker).super_DObject.ObjectFlags & 0x20) != 0)) {
        (&DAT_00a39408)[(long)consoleplayer * 0x54] = 0;
        pAVar11 = (AActor *)0x0;
      }
      if ((20.0 <= ABS((pAVar11->__Pos).X - ((local_198.Array)->start).X)) ||
         (20.0 <= ABS((pAVar11->__Pos).Y - ((local_198.Array)->start).Y))) {
        lVar16 = ((ulong)local_198._8_8_ >> 0x20) * 0x68;
        pTVar15 = (TrailSegment *)0x0;
        pTVar14 = local_198.Array;
        do {
          if ((pTVar15 == (TrailSegment *)0x0) ||
             (pTVar14->sounddist <= pTVar15->sounddist && pTVar15->sounddist != pTVar14->sounddist))
          {
            pTVar15 = pTVar14;
          }
          pTVar14 = pTVar14 + 1;
          lVar16 = lVar16 + -0x68;
        } while (lVar16 != 0);
        local_98.start.X = (pTVar15->soundpos).X;
        local_98.start.Y = (pTVar15->soundpos).Y;
        local_98.start.Z = ViewPos.Z;
        local_a0.ID = FVar6.ID;
        S_Sound(&local_98.start,1,&local_a0,1.0,1.0);
      }
      else {
        local_9c.ID = FVar6.ID;
        S_Sound(pAVar11,1,&local_9c,1.0,1.0);
      }
    }
    iVar13 = r_rail_spiralsparsity.Value;
    local_138 = (double)(CONCAT44(local_138._4_4_,
                                  CONCAT31((int3)((ulong)local_138 >> 8),SUB81(local_138,0) >> 3)) &
                        0xffffffffffffff01);
    if (iVar17 == -1) {
      local_188 = (double)CONCAT44(local_188._4_4_,0xffffffff);
    }
    else if (((color2 == -1) || (r_rail_smartspiral.Value == false)) &&
            (spawnclass == (PClassActor *)0x0 && 0 < r_rail_spiralsparsity.Value)) {
      local_128 = (local_198.Array)->length;
      if (local_188._0_4_ == 0) {
        local_188 = (double)CONCAT44(local_188._4_4_,0xffffffff);
      }
      else {
        uVar7 = ParticleColor(local_188._0_4_);
        local_188 = (double)CONCAT44(local_188._4_4_,uVar7);
      }
      iVar17 = (int)((double)(iVar13 * SUB84(dVar21,0)) / local_178);
      if (iVar17 != 0) {
        local_e8 = (double)(iVar13 * 3) * local_178;
        local_168 = (double)SpiralOffset;
        local_1b0 = ((local_198.Array)->start).X;
        local_1b8 = ((local_198.Array)->start).Y;
        local_158 = ((local_198.Array)->start).Z;
        local_ec = 0x23;
        if (duration != 0) {
          local_ec = duration;
        }
        uVar19 = 0;
        local_f8 = dVar21;
        do {
          pTVar14 = local_198.Array;
          WVar5 = InactiveParticles;
          if (InactiveParticles == 0xffff) {
            ppVar12 = (particle_t *)0x0;
          }
          else {
            uVar18 = (ulong)InactiveParticles;
            ppVar12 = Particles + uVar18;
            InactiveParticles = Particles[uVar18].tnext;
            Particles[uVar18].tnext = ActiveParticles;
            ActiveParticles = WVar5;
          }
          if (ppVar12 == (particle_t *)0x0) {
            iVar13 = 1;
LAB_004f0554:
            bVar4 = false;
          }
          else {
            ppVar12->trans = 0xff;
            ppVar12->ttl = (BYTE)duration;
            ppVar12->fade = (BYTE)(0xff / (long)local_ec);
            ppVar12->size = 3.0;
            ppVar12->bright = SUB81(local_138,0);
            local_108 = FFastTrig::cos(&fasttrig,local_168 * 11930464.711111112 + 6755399441055744.0
                                      );
            dVar22 = FFastTrig::sin(&fasttrig,local_108);
            dVar3 = 1.0 - local_108;
            dVar21 = pTVar14[uVar19].dir.X;
            dVar20 = pTVar14[uVar19].dir.Y;
            dVar27 = pTVar14[uVar19].dir.Z;
            dVar26 = dVar3 * dVar21;
            dVar31 = dVar20 * dVar3 * dVar20;
            dVar30 = dVar3 * dVar20 * dVar27;
            dVar29 = local_198.Array[uVar19].extend.X;
            dVar25 = local_198.Array[uVar19].extend.Y;
            dVar24 = local_198.Array[uVar19].extend.Z;
            dVar23 = (dVar22 * dVar20 + dVar26 * dVar27) * dVar24 +
                     (dVar26 * dVar20 - dVar22 * dVar27) * dVar25 +
                     (local_108 + dVar21 * dVar26) * dVar29;
            dVar28 = (dVar30 - dVar22 * dVar21) * dVar24 +
                     (local_108 + dVar31) * dVar25 + (dVar26 * dVar20 + dVar22 * dVar27) * dVar29;
            dVar21 = (((dVar3 - dVar21 * dVar26) - dVar31) + local_108) * dVar24 +
                     (dVar30 + dVar22 * dVar21) * dVar25 +
                     (dVar26 * dVar27 - dVar22 * dVar20) * dVar29;
            (ppVar12->Vel).Z = dVar21 * local_118 * 0.0625;
            (ppVar12->Vel).Y = dVar28 * local_118 * 0.0625;
            (ppVar12->Vel).X = dVar23 * local_118 * 0.0625;
            (ppVar12->Pos).Z = local_158 + dVar21;
            (ppVar12->Pos).Y = local_1b8 + dVar28;
            (ppVar12->Pos).X = local_1b0 + dVar23;
            iVar13 = r_rail_spiralsparsity.Value;
            local_108 = local_198.Array[uVar19].dir.X * local_e8;
            local_d8 = local_198.Array[uVar19].dir.Y * local_e8;
            local_a8 = local_198.Array[uVar19].dir.Z * local_e8;
            iVar8 = local_188._0_4_;
            if (local_188._0_4_ == -1) {
              uVar9 = FRandom::GenRand32(&M_Random);
              uVar9 = uVar9 & 0xff;
              iVar8 = rblue2;
              if (((0x9a < uVar9) && (iVar8 = rblue1, 0xbb < uVar9)) &&
                 (iVar8 = rblue4, uVar9 < 0xde)) {
                iVar8 = rblue3;
              }
            }
            ppVar12->color = iVar8;
            local_1b0 = local_1b0 + local_108;
            local_1b8 = local_1b8 + local_d8;
            local_158 = local_158 + local_a8;
            local_168 = local_168 + (double)(iVar13 * 0xe);
            local_128 = local_128 - local_e8;
            iVar13 = 0;
            bVar4 = true;
            if (local_128 <= 0.0) {
              uVar19 = uVar19 + 1;
              iVar13 = 0;
              if (local_198.Count <= uVar19) {
                iVar13 = 10;
                goto LAB_004f0554;
              }
              local_1b0 = local_198.Array[uVar19].start.X -
                          local_198.Array[uVar19].dir.X * local_128;
              local_1b8 = local_198.Array[uVar19].start.Y -
                          local_198.Array[uVar19].dir.Y * local_128;
              local_158 = local_198.Array[uVar19].start.Z -
                          local_198.Array[uVar19].dir.Z * local_128;
              local_128 = local_128 + local_198.Array[uVar19].length;
            }
          }
          dVar21 = local_f8;
          if (iVar13 != 0) {
            if ((iVar13 != 10) && (!bVar4)) goto LAB_004f009a;
            break;
          }
          iVar17 = iVar17 + -1;
        } while (iVar17 != 0);
      }
    }
    iVar13 = r_rail_trailsparsity.Value;
    iVar17 = r_rail_spiralsparsity.Value;
    if ((color2 == -1) || (spawnclass != (PClassActor *)0x0 || r_rail_trailsparsity.Value < 1)) {
      if (spawnclass != (PClassActor *)0x0) {
        local_118 = (double)(~-(ulong)(local_178 < 1.0) & (ulong)local_178 |
                            -(ulong)(local_178 < 1.0) & 0x4040000000000000);
        uStack_110 = 0;
        iVar17 = (int)((double)(SUB84(dVar21,0) * 3) / local_118);
        if (iVar17 != 0) {
          local_118 = local_118 * (double)(r_rail_spiralsparsity.Value * 3);
          uStack_110 = 0;
          local_1a8 = (local_198.Array)->length;
          local_1b0 = ((local_198.Array)->start).X;
          local_1b8 = ((local_198.Array)->start).Y;
          local_1a0 = ((local_198.Array)->start).Z;
          local_158 = -local_148;
          uStack_150 = uStack_140 ^ 0x8000000000000000;
          uVar19 = 0;
          local_138 = 0.0;
          uStack_130 = 0;
          local_178 = 0.0;
          uStack_170 = 0;
          local_188 = 0.0;
          uStack_180 = 0;
          do {
            iVar17 = iVar17 + -1;
            if (0.0 < local_148) {
              uVar9 = FRandom::GenRand32(&pr_railtrail);
              if ((uVar9 & 1) != 0) {
                dVar21 = local_138 + (double)(int)(-(uint)((uVar9 & 8) == 0) | 1);
                local_138 = (double)(~-(ulong)(local_158 < dVar21) & (ulong)local_158 |
                                    (-(ulong)(local_148 <= dVar21) & (ulong)local_148 |
                                    ~-(ulong)(local_148 <= dVar21) & (ulong)dVar21) &
                                    -(ulong)(local_158 < dVar21));
                uStack_130 = ~uStack_130 & uStack_150 |
                             (uStack_140 | ~uStack_140 & uStack_130) & uStack_130;
              }
              if ((uVar9 & 2) != 0) {
                local_178 = local_178 + (double)(int)(-(uint)((uVar9 & 0x10) == 0) | 1);
                local_178 = (double)(~-(ulong)(local_158 < local_178) & (ulong)local_158 |
                                    (-(ulong)(local_148 <= local_178) & (ulong)local_148 |
                                    ~-(ulong)(local_148 <= local_178) & (ulong)local_178) &
                                    -(ulong)(local_158 < local_178));
                uStack_170 = ~uStack_170 & uStack_150 |
                             (uStack_140 | ~uStack_140 & uStack_170) & uStack_170;
              }
              if ((uVar9 & 4) != 0) {
                dVar21 = local_188 + (double)(int)(-(uint)((uVar9 & 0x20) == 0) | 1);
                local_188 = (double)(~-(ulong)(local_158 < dVar21) & (ulong)local_158 |
                                    (-(ulong)(local_148 <= dVar21) & (ulong)local_148 |
                                    ~-(ulong)(local_148 <= dVar21) & (ulong)dVar21) &
                                    -(ulong)(local_158 < dVar21));
                uStack_180 = ~uStack_180 & uStack_150 |
                             (uStack_140 | ~uStack_140 & uStack_180) & uStack_180;
              }
            }
            pAVar10 = local_160;
            local_98.start.X = local_1b0 + local_138;
            local_98.start.Y = local_1b8 + local_178;
            local_98.start.Z = local_1a0 + local_188;
            pAVar11 = AActor::StaticSpawn(spawnclass,&local_98.start,ALLOW_REPLACE,false);
            if (pAVar11 != (AActor *)0x0) {
              if (pAVar10 != (AWeapon *)0x0) {
                (pAVar11->target).field_0.p = (AActor *)pAVar10;
              }
              (pAVar11->Angles).Pitch.Degrees = pitch->Degrees;
              (pAVar11->Angles).Yaw.Degrees = angle->Degrees;
            }
            local_1b0 = local_1b0 + local_198.Array[uVar19].dir.X * local_118;
            local_1b8 = local_1b8 + local_198.Array[uVar19].dir.Y * local_118;
            local_1a0 = local_1a0 + local_198.Array[uVar19].dir.Z * local_118;
            local_1a8 = local_1a8 - local_118;
            if (0.0 < local_1a8) {
LAB_004efc54:
              bVar4 = false;
            }
            else {
              uVar19 = uVar19 + 1;
              bVar4 = true;
              if (uVar19 < local_198.Count) {
                local_1b0 = local_198.Array[uVar19].start.X -
                            local_198.Array[uVar19].dir.X * local_1a8;
                local_1b8 = local_198.Array[uVar19].start.Y -
                            local_198.Array[uVar19].dir.Y * local_1a8;
                local_1a0 = local_198.Array[uVar19].start.Z -
                            local_198.Array[uVar19].dir.Z * local_1a8;
                local_1a8 = local_1a8 + local_198.Array[uVar19].length;
                goto LAB_004efc54;
              }
            }
          } while ((!bVar4) && (iVar17 != 0));
        }
      }
    }
    else {
      if (color2 == 0) {
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = ParticleColor(color2);
      }
      iVar13 = SUB84((double)(iVar13 * SUB84(dVar21,0)) / local_178 + -0.499999985 +
                     6755399441055744.0,0);
      if (iVar13 != 0) {
        local_178 = (double)(iVar17 * 3) * local_178;
        local_1a8 = (local_198.Array)->length;
        local_1b0 = ((local_198.Array)->start).X;
        local_1b8 = ((local_198.Array)->start).Y;
        local_1a0 = ((local_198.Array)->start).Z;
        iVar17 = 0x21;
        if (duration != 0) {
          iVar17 = duration;
        }
        local_168 = (double)(float)local_118;
        local_d8 = -local_148;
        uStack_d0 = uStack_140 ^ 0x8000000000000000;
        uVar19 = 0;
        local_128 = 0.0;
        uStack_120 = 0;
        local_e8 = 0.0;
        uStack_e0 = 0;
        local_108 = 0.0;
        uStack_100 = 0;
        do {
          iVar13 = iVar13 + -1;
          ppVar12 = JitterParticle(iVar17,local_168);
          bVar4 = true;
          if (ppVar12 != (particle_t *)0x0) {
            if (0.0 < local_148) {
              uVar9 = FRandom::GenRand32(&M_Random);
              if ((uVar9 & 1) != 0) {
                local_108 = local_108 + (double)(int)(-(uint)((uVar9 & 8) == 0) | 1);
                local_108 = (double)(~-(ulong)(local_d8 < local_108) & (ulong)local_d8 |
                                    (-(ulong)(local_148 <= local_108) & (ulong)local_148 |
                                    ~-(ulong)(local_148 <= local_108) & (ulong)local_108) &
                                    -(ulong)(local_d8 < local_108));
                uStack_100 = ~uStack_100 & uStack_d0 |
                             (uStack_140 | ~uStack_140 & uStack_100) & uStack_100;
              }
              if ((uVar9 & 2) != 0) {
                local_e8 = local_e8 + (double)(int)(-(uint)((uVar9 & 0x10) == 0) | 1);
                local_e8 = (double)(~-(ulong)(local_d8 < local_e8) & (ulong)local_d8 |
                                   (-(ulong)(local_148 <= local_e8) & (ulong)local_148 |
                                   ~-(ulong)(local_148 <= local_e8) & (ulong)local_e8) &
                                   -(ulong)(local_d8 < local_e8));
                uStack_e0 = ~uStack_e0 & uStack_d0 |
                            (uStack_140 | ~uStack_140 & uStack_e0) & uStack_e0;
              }
              if ((uVar9 & 4) != 0) {
                local_128 = local_128 + (double)(int)(-(uint)((uVar9 & 0x20) == 0) | 1);
                local_128 = (double)(~-(ulong)(local_d8 < local_128) & (ulong)local_d8 |
                                    (-(ulong)(local_148 <= local_128) & (ulong)local_148 |
                                    ~-(ulong)(local_148 <= local_128) & (ulong)local_128) &
                                    -(ulong)(local_d8 < local_128));
                uStack_120 = ~uStack_120 & uStack_d0 |
                             (uStack_140 | ~uStack_140 & uStack_120) & uStack_120;
              }
            }
            ppVar12->size = 2.0;
            (ppVar12->Pos).Z = local_1a0 + local_128;
            (ppVar12->Pos).Y = local_1b8 + local_e8;
            (ppVar12->Pos).X = local_1b0 + local_108;
            if (local_188._0_4_ != -1) {
              (ppVar12->Acc).Z = (ppVar12->Acc).Z + -0.000244140625;
            }
            local_160 = (AWeapon *)(local_198.Array[uVar19].dir.X * local_178);
            local_118 = local_198.Array[uVar19].dir.Y * local_178;
            local_158 = local_198.Array[uVar19].dir.Z * local_178;
            ppVar12->bright = SUB81(local_138,0);
            if (uVar7 == 0xffffffff) {
              uVar9 = FRandom::GenRand32(&M_Random);
              iVar8 = grey4;
              if ((0x54 < (uVar9 & 0xff)) && (iVar8 = grey1, (uVar9 & 0xff) < 0xaa)) {
                iVar8 = grey2;
              }
              ppVar12->color = iVar8;
            }
            else {
              ppVar12->color = uVar7;
            }
            local_1b0 = local_1b0 + (double)local_160;
            local_1b8 = local_1b8 + local_118;
            local_1a0 = local_1a0 + local_158;
            local_1a8 = local_1a8 - local_178;
            if (local_1a8 <= 0.0) {
              uVar19 = uVar19 + 1;
              if (local_198.Count <= uVar19) goto LAB_004f0088;
              local_1b0 = local_198.Array[uVar19].start.X -
                          local_198.Array[uVar19].dir.X * local_1a8;
              local_1b8 = local_198.Array[uVar19].start.Y -
                          local_198.Array[uVar19].dir.Y * local_1a8;
              local_1a0 = local_198.Array[uVar19].start.Z -
                          local_198.Array[uVar19].dir.Z * local_1a8;
              local_1a8 = local_1a8 + local_198.Array[uVar19].length;
            }
            bVar4 = false;
          }
LAB_004f0088:
        } while ((!bVar4) && (iVar13 != 0));
      }
    }
  }
LAB_004f009a:
  TArray<TrailSegment,_TrailSegment>::~TArray(&local_198);
  return;
}

Assistant:

void P_DrawRailTrail(AActor *source, TArray<SPortalHit> &portalhits, int color1, int color2, double maxdiff, int flags, PClassActor *spawnclass, DAngle angle, int duration, double sparsity, double drift, int SpiralOffset, DAngle pitch)
{
	double length = 0;
	int steps, i;
	TArray<TrailSegment> trail;
	TAngle<double> deg;
	DVector3 pos;
	bool fullbright;
	unsigned segment;
	double lencount;

	for (unsigned i = 0; i < portalhits.Size() - 1; i++)
	{
		TrailSegment seg;

		seg.start = portalhits[i].ContPos;
		seg.dir = portalhits[i].OutDir;
		seg.length = (portalhits[i + 1].HitPos - seg.start).Length();

		//Calculate PerpendicularVector (extend, dir):
		double minelem = 1;
		int epos;
		int ii;
		for (epos = 0, ii = 0; ii < 3; ++ii)
		{
			if (fabs(seg.dir[ii]) < minelem)
			{
				epos = ii;
				minelem = fabs(seg.dir[ii]);
			}
		}
		DVector3 tempvec(0, 0, 0);
		tempvec[epos] = 1;
		seg.extend = (tempvec - (seg.dir | tempvec) * seg.dir) * 3;
		length += seg.length;

		// Only consider sound in 2D (for now, anyway)
		// [BB] You have to divide by lengthsquared here, not multiply with it.
		AActor *mo = players[consoleplayer].camera;

		double r = ((seg.start.Y - mo->Y()) * (-seg.dir.Y) - (seg.start.X - mo->X()) * (seg.dir.X)) / (seg.length * seg.length);
		r = clamp<double>(r, 0., 1.);
		seg.soundpos = seg.start + r * seg.dir;
		seg.sounddist = (seg.soundpos - mo->Pos()).LengthSquared();
		trail.Push(seg);
	}

	steps = xs_FloorToInt(length / 3);
	fullbright = !!(flags & RAF_FULLBRIGHT);

	if (steps)
	{
		if (!(flags & RAF_SILENT))
		{
			FSoundID sound;
			
			// Allow other sounds than 'weapons/railgf'!
			if (!source->player) sound = source->AttackSound;
			else if (source->player->ReadyWeapon) sound = source->player->ReadyWeapon->AttackSound;
			else sound = 0;
			if (!sound) sound = "weapons/railgf";

			// The railgun's sound is special. It gets played from the
			// point on the slug's trail that is closest to the hearing player.
			AActor *mo = players[consoleplayer].camera;

			if (fabs(mo->X() - trail[0].start.X) < 20 && fabs(mo->Y() - trail[0].start.Y) < 20)
			{ // This player (probably) fired the railgun
				S_Sound (mo, CHAN_WEAPON, sound, 1, ATTN_NORM);
			}
			else
			{
				TrailSegment *shortest = NULL;
				for (auto &seg : trail)
				{
					if (shortest == NULL || shortest->sounddist > seg.sounddist) shortest = &seg;
				}
				S_Sound (DVector3(shortest->soundpos, ViewPos.Z), CHAN_WEAPON, sound, 1, ATTN_NORM);
			}
		}
	}
	else
	{
		// line is 0 length, so nothing to do
		return;
	}

	// Create the outer spiral.
	if (color1 != -1 && (!r_rail_smartspiral || color2 == -1) && r_rail_spiralsparsity > 0 && (spawnclass == NULL))
	{
		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int spiral_steps = (int)(steps * r_rail_spiralsparsity / sparsity);
		segment = 0;
		lencount = trail[0].length;
		
		color1 = color1 == 0 ? -1 : ParticleColor(color1);
		pos = trail[0].start;
		deg = (double)SpiralOffset;
		for (i = spiral_steps; i; i--)
		{
			particle_t *p = NewParticle ();
			DVector3 tempvec;

			if (!p)
				return;

			int spiralduration = (duration == 0) ? 35 : duration;

			p->trans = 255;
			p->ttl = duration;
			p->fade = FADEFROMTTL(spiralduration);
			p->size = 3;
			p->bright = fullbright;

			tempvec = DMatrix3x3(trail[segment].dir, deg) * trail[segment].extend;
			p->Vel = tempvec * drift / 16.;
			p->Pos = tempvec + pos;
			pos += trail[segment].dir * stepsize;
			deg += double(r_rail_spiralsparsity * 14);
			lencount -= stepsize;
			if (color1 == -1)
			{
				int rand = M_Random();

				if (rand < 155)
					p->color = rblue2;
				else if (rand < 188)
					p->color = rblue1;
				else if (rand < 222)
					p->color = rblue3;
				else
					p->color = rblue4;
			}
			else 
			{
				p->color = color1;
			}

			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}
		}
	}

	// Create the inner trail.
	if (color2 != -1 && r_rail_trailsparsity > 0 && spawnclass == NULL)
	{
		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int trail_steps = xs_FloorToInt(steps * r_rail_trailsparsity / sparsity);

		color2 = color2 == 0 ? -1 : ParticleColor(color2);
		DVector3 diff(0, 0, 0);

		pos = trail[0].start;
		lencount = trail[0].length;
		segment = 0;
		for (i = trail_steps; i; i--)
		{
			// [XA] inner trail uses a different default duration (33).
			int innerduration = (duration == 0) ? 33 : duration;
			particle_t *p = JitterParticle (innerduration, (float)drift);

			if (!p)
				return;

			if (maxdiff > 0)
			{
				int rnd = M_Random ();
				if (rnd & 1)
					diff.X = clamp<double>(diff.X + ((rnd & 8) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 2)
					diff.Y = clamp<double>(diff.Y + ((rnd & 16) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 4)
					diff.Z = clamp<double>(diff.Z + ((rnd & 32) ? 1 : -1), -maxdiff, maxdiff);
			}

			DVector3 postmp = pos + diff;

			p->size = 2;
			p->Pos = postmp;
			if (color1 != -1)
				p->Acc.Z -= 1./4096;
			pos += trail[segment].dir * stepsize;
			lencount -= stepsize;
			p->bright = fullbright;

			if (color2 == -1)
			{
				int rand = M_Random();

				if (rand < 85)
					p->color = grey4;
				else if (rand < 170)
					p->color = grey2;
				else
					p->color = grey1;
			}
			else 
			{
				p->color = color2;
			}
			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}

		}
	}
	// create actors
	if (spawnclass != NULL)
	{
		if (sparsity < 1)
			sparsity = 32;

		double stepsize = 3 * r_rail_spiralsparsity * sparsity;
		int trail_steps = (int)((steps * 3) / sparsity);
		DVector3 diff(0, 0, 0);

		pos = trail[0].start;
		lencount = trail[0].length;
		segment = 0;

		for (i = trail_steps; i; i--)
		{
			if (maxdiff > 0)
			{
				int rnd = pr_railtrail();
				if (rnd & 1)
					diff.X = clamp<double>(diff.X + ((rnd & 8) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 2)
					diff.Y = clamp<double>(diff.Y + ((rnd & 16) ? 1 : -1), -maxdiff, maxdiff);
				if (rnd & 4)
					diff.Z = clamp<double>(diff.Z + ((rnd & 32) ? 1 : -1), -maxdiff, maxdiff);
			}			
			AActor *thing = Spawn (spawnclass, pos + diff, ALLOW_REPLACE);
			if (thing)
			{
				if (source)	thing->target = source;
				thing->Angles.Pitch = pitch;
				thing->Angles.Yaw = angle;
			}
			pos += trail[segment].dir * stepsize;
			lencount -= stepsize;
			if (lencount <= 0)
			{
				segment++;
				if (segment < trail.Size())
				{
					pos = trail[segment].start - trail[segment].dir * lencount;
					lencount += trail[segment].length;
				}
				else
				{
					// should never happen but if something goes wrong, just terminate the loop.
					break;
				}
			}
		}
	}
}